

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_agent_forward_ok.c
# Opt level: O2

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  pcVar2 = (char *)libssh2_userauth_list(session,"libssh2",7);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "libssh2_userauth_list";
  }
  else {
    pcVar3 = strstr(pcVar2,"publickey");
    if (pcVar3 == (char *)0x0) {
      libssh2_userauth_publickey_fromfile_ex
                (_stderr,"\'publickey\' was expected in userauth list: %s\n",pcVar2);
      return 1;
    }
    pcVar2 = srcdir_path("key_rsa.pub");
    pcVar3 = srcdir_path("key_rsa");
    iVar1 = libssh2_userauth_publickey_fromfile_ex(session,"libssh2",7,pcVar2,pcVar3,0);
    if (iVar1 == 0) {
      uVar4 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,0);
      iVar1 = libssh2_channel_request_auth_agent(uVar4);
      if (iVar1 != 0) {
        libssh2_userauth_publickey_fromfile_ex
                  (_stderr,"Auth agent request for agent forwarding failed, error code %d\n",iVar1);
        return 1;
      }
      return 0;
    }
    pcVar2 = "libssh2_userauth_publickey_fromfile_ex";
  }
  print_last_session_error(pcVar2);
  return 1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    int rc;
    LIBSSH2_CHANNEL *channel;

    const char *userauth_list =
        libssh2_userauth_list(session, username,
                              (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                srcdir_path(key_file_public),
                                                srcdir_path(key_file_private),
                                                NULL);
    if(rc) {
        print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
        return 1;
    }

    channel = libssh2_channel_open_session(session);
    #if 0
    if(!channel) {
        printf("Error opening channel\n");
        return 1;
    }
    #endif

    rc = libssh2_channel_request_auth_agent(channel);
    if(rc) {
        fprintf(stderr, "Auth agent request for agent forwarding failed, "
            "error code %d\n", rc);
        return 1;
    }

    return 0;
}